

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

int __thiscall btSoftBody::generateClusters(btSoftBody *this,int k,int maxiterations)

{
  long lVar1;
  Cluster *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Cluster *pCVar8;
  Cluster **ppCVar9;
  Node *pNVar10;
  float *pfVar11;
  Node **ppNVar12;
  btVector3 *pbVar13;
  Node *pNVar14;
  int *piVar15;
  Face *pFVar16;
  void *pvVar17;
  Cluster **b;
  btAlignedObjectArray<bool> *this_00;
  bool *pbVar18;
  int in_EDX;
  long in_RDI;
  btScalar bVar19;
  btVector3 bVar20;
  btSoftBody *in_stack_000000e0;
  int j_6;
  int i_4;
  Cluster *clb;
  Cluster *cla;
  bool connected;
  int c1;
  int c0;
  int j_5;
  int j_4;
  int i_3;
  Cluster *pmaster;
  int kid;
  int q;
  int cid;
  int j_3;
  int idx [3];
  int j_2;
  btAlignedObjectArray<int> cids;
  btScalar d;
  int j_1;
  btScalar kdist;
  int kbest;
  btVector3 nx;
  int j;
  btVector3 c;
  int i_2;
  btScalar w;
  int iterations;
  bool changed;
  btScalar slope;
  int i_1;
  btVector3 cog;
  btAlignedObjectArray<btVector3> centers;
  int i;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  btSoftBody *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  byte bVar21;
  btSoftBody *in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa7c;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  Cluster *in_stack_fffffffffffffab0;
  btSoftBody *in_stack_fffffffffffffbf0;
  bool local_399;
  btScalar local_2f8;
  btScalar bStack_2f4;
  btScalar local_2d8;
  btScalar bStack_2d4;
  btScalar local_2b8;
  btScalar bStack_2b4;
  int local_1e8;
  int local_1e4;
  int local_1c8;
  int local_1c4;
  int local_1bc;
  int local_1ac;
  int local_194;
  int local_170;
  int local_168;
  int local_164 [5];
  btAlignedObjectArray<int> local_150;
  Node *local_130;
  btScalar local_128;
  int local_124;
  btScalar local_120;
  int local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_fc;
  undefined8 local_f4;
  btScalar local_ec;
  btScalar bStack_e8;
  undefined8 local_e4;
  btScalar local_dc;
  btScalar bStack_d8;
  undefined8 local_d4;
  btScalar local_cc;
  btScalar bStack_c8;
  btScalar abStack_c4 [2];
  float local_bc;
  int local_b8;
  btScalar local_b4;
  btScalar local_b0;
  btScalar local_ac;
  btVector3 local_a8;
  int local_98;
  float local_94;
  float local_90;
  float local_8c;
  int local_88;
  byte local_81;
  undefined4 local_80;
  float local_7c;
  Node *local_78;
  int local_70;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btVector3 local_50;
  btAlignedObjectArray<btVector3> local_40;
  undefined8 local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  releaseClusters(in_stack_fffffffffffffa60);
  local_18 = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  btMin<int>(local_c,&local_18);
  local_20 = 0;
  btAlignedObjectArray<btSoftBody::Cluster_*>::resize
            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),in_stack_fffffffffffffa7c
             ,(Cluster **)in_stack_fffffffffffffa70);
  for (local_14 = 0; iVar5 = local_14,
      iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
      iVar5 < iVar4; local_14 = local_14 + 1) {
    pCVar8 = (Cluster *)
             btAlignedAllocInternal((size_t)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
    Cluster::Cluster(in_stack_fffffffffffffab0);
    ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_14);
    *ppCVar9 = pCVar8;
    ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_14);
    (*ppCVar9)->m_collide = true;
  }
  local_c[0] = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                         ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
  if (local_c[0] < 1) {
    iVar5 = btAlignedObjectArray<btSoftBody::Tetra>::size
                      ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
    if (iVar5 == 0) {
      btAlignedObjectArray<btSoftBody::Face>::size
                ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
      btAlignedObjectArray<btSoftBody::Cluster_*>::resize
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa7c,(Cluster **)in_stack_fffffffffffffa70);
      for (local_14 = 0; iVar5 = local_14,
          iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
          iVar5 < iVar4; local_14 = local_14 + 1) {
        pCVar8 = (Cluster *)
                 btAlignedAllocInternal((size_t)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c)
        ;
        Cluster::Cluster(pCVar8);
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_14);
        *ppCVar9 = pCVar8;
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_14);
        (*ppCVar9)->m_collide = true;
      }
      for (local_14 = 0; iVar5 = local_14,
          iVar4 = btAlignedObjectArray<btSoftBody::Face>::size
                            ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0)),
          iVar5 < iVar4; local_14 = local_14 + 1) {
        for (local_1bc = 0; local_1bc < 3; local_1bc = local_1bc + 1) {
          btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_14);
          btAlignedObjectArray<btSoftBody::Face>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_14);
          btAlignedObjectArray<btSoftBody::Node_*>::push_back
                    ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                     (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        }
      }
    }
    else {
      btAlignedObjectArray<btSoftBody::Tetra>::size
                ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
      btAlignedObjectArray<btSoftBody::Cluster_*>::resize
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa7c,(Cluster **)in_stack_fffffffffffffa70);
      for (local_14 = 0; iVar5 = local_14,
          iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
          iVar5 < iVar4; local_14 = local_14 + 1) {
        pCVar8 = (Cluster *)
                 btAlignedAllocInternal((size_t)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c)
        ;
        Cluster::Cluster(in_stack_fffffffffffffab0);
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_14);
        *ppCVar9 = pCVar8;
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_14);
        (*ppCVar9)->m_collide = true;
      }
      for (local_14 = 0; iVar5 = local_14,
          iVar4 = btAlignedObjectArray<btSoftBody::Tetra>::size
                            ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0)),
          iVar5 < iVar4; local_14 = local_14 + 1) {
        for (local_1ac = 0; local_1ac < 4; local_1ac = local_1ac + 1) {
          btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_14);
          btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_14);
          btAlignedObjectArray<btSoftBody::Node_*>::push_back
                    ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                     (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        }
      }
    }
  }
  else {
    btAlignedObjectArray<btVector3>::btAlignedObjectArray
              ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffa60);
    local_54 = 0.0;
    local_58 = 0.0;
    local_5c = 0.0;
    btVector3::btVector3(&local_50,&local_54,&local_58,&local_5c);
    for (local_70 = 0; iVar5 = local_70,
        iVar4 = btAlignedObjectArray<btSoftBody::Node>::size
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
        iVar5 < iVar4; local_70 = local_70 + 1) {
      pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_70);
      btVector3::operator+=(&local_50,&pNVar10->m_x);
      iVar5 = local_70 * 0x74b1;
      iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
      btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),iVar5 % iVar4);
      local_78 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_70);
      btAlignedObjectArray<btSoftBody::Node_*>::push_back
                ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                 (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    }
    iVar5 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    local_7c = (float)iVar5;
    btVector3::operator/=
              ((btVector3 *)in_stack_fffffffffffffa60,
               (btScalar *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    btAlignedObjectArray<btVector3>::resize
              ((btAlignedObjectArray<btVector3> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,(btVector3 *)in_stack_fffffffffffffa70);
    local_80 = 0x41800000;
    local_88 = 0;
    do {
      local_90 = 1.0;
      local_94 = (float)local_88 * 0.0625;
      pfVar11 = btMin<float>(&local_90,&local_94);
      local_8c = 2.0 - *pfVar11;
      local_81 = 0;
      local_88 = local_88 + 1;
      for (local_98 = 0; local_98 < local_c[0]; local_98 = local_98 + 1) {
        local_ac = 0.0;
        local_b0 = 0.0;
        local_b4 = 0.0;
        btVector3::btVector3(&local_a8,&local_ac,&local_b0,&local_b4);
        local_b8 = 0;
        while( true ) {
          iVar5 = local_b8;
          ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                               local_98);
          iVar4 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
          if (iVar4 <= iVar5) break;
          ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                               local_98);
          ppNVar12 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                               (&(*ppCVar9)->m_nodes,local_b8);
          btVector3::operator+=(&local_a8,&(*ppNVar12)->m_x);
          local_b8 = local_b8 + 1;
        }
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_98);
        iVar5 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
        if (iVar5 != 0) {
          ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                               local_98);
          iVar5 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
          local_bc = (float)iVar5;
          btVector3::operator/=
                    ((btVector3 *)in_stack_fffffffffffffa60,
                     (btScalar *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          btAlignedObjectArray<btVector3>::operator[](&local_40,local_98);
          btAlignedObjectArray<btVector3>::operator[](&local_40,local_98);
          bVar20 = operator-((btVector3 *)in_stack_fffffffffffffa70,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          local_e4 = bVar20.m_floats._8_8_;
          local_2b8 = bVar20.m_floats[0];
          bStack_2b4 = bVar20.m_floats[1];
          local_ec = local_2b8;
          bStack_e8 = bStack_2b4;
          bVar20 = ::operator*((btVector3 *)in_stack_fffffffffffffa70,
                               (btScalar *)
                               CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          local_d4 = bVar20.m_floats._8_8_;
          local_2d8 = bVar20.m_floats[0];
          bStack_2d4 = bVar20.m_floats[1];
          local_dc = local_2d8;
          bStack_d8 = bStack_2d4;
          bVar20 = operator+((btVector3 *)in_stack_fffffffffffffa70,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          abStack_c4 = bVar20.m_floats._8_8_;
          local_a8.m_floats._0_8_ = bVar20.m_floats._0_8_;
          local_2f8 = bVar20.m_floats[0];
          bStack_2f4 = bVar20.m_floats[1];
          local_cc = local_2f8;
          bStack_c8 = bStack_2f4;
          local_a8.m_floats._8_8_ = abStack_c4;
          btAlignedObjectArray<btVector3>::operator[](&local_40,local_98);
          bVar20 = operator-((btVector3 *)in_stack_fffffffffffffa70,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          local_f4 = bVar20.m_floats._8_8_;
          local_fc = bVar20.m_floats._0_8_;
          bVar19 = btVector3::length2((btVector3 *)0x2700e7);
          local_81 = local_81 & 1 | 1.1920929e-07 < bVar19;
          pbVar13 = btAlignedObjectArray<btVector3>::operator[](&local_40,local_98);
          *(undefined8 *)pbVar13->m_floats = local_a8.m_floats._0_8_;
          *(undefined8 *)(pbVar13->m_floats + 2) = local_a8.m_floats._8_8_;
          btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_98);
          local_108 = 0;
          btAlignedObjectArray<btSoftBody::Node_*>::resize
                    ((btAlignedObjectArray<btSoftBody::Node_*> *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     in_stack_fffffffffffffa7c,(Node **)in_stack_fffffffffffffa70);
        }
      }
      for (local_98 = 0; iVar5 = local_98,
          iVar4 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
          iVar5 < iVar4; local_98 = local_98 + 1) {
        pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_98);
        local_118 = *(undefined8 *)(pNVar10->m_x).m_floats;
        uStack_110 = *(undefined8 *)((pNVar10->m_x).m_floats + 2);
        local_11c = 0;
        btAlignedObjectArray<btVector3>::operator[](&local_40,0);
        local_120 = ClusterMetric((btVector3 *)in_stack_fffffffffffffa70,
                                  (btVector3 *)
                                  CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        for (local_124 = 1; local_124 < local_c[0]; local_124 = local_124 + 1) {
          btAlignedObjectArray<btVector3>::operator[](&local_40,local_124);
          local_128 = ClusterMetric((btVector3 *)in_stack_fffffffffffffa70,
                                    (btVector3 *)
                                    CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          if (local_128 < local_120) {
            local_11c = local_124;
            local_120 = local_128;
          }
        }
        btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_11c);
        local_130 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                              ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_98);
        btAlignedObjectArray<btSoftBody::Node_*>::push_back
                  ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                   (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      }
      local_399 = (local_81 & 1) != 0 && local_88 < local_10;
    } while (local_399);
    btAlignedObjectArray<int>::btAlignedObjectArray
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffffa60);
    btAlignedObjectArray<btSoftBody::Node>::size
              ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    local_164[4] = 0xffffffff;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,(int *)in_stack_fffffffffffffa70);
    for (local_70 = 0; iVar5 = local_70,
        iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
        iVar5 < iVar4; local_70 = local_70 + 1) {
      local_164[3] = 0;
      while( true ) {
        iVar5 = local_164[3];
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_70);
        iVar6 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
        iVar4 = local_70;
        if (iVar6 <= iVar5) break;
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_70);
        ppNVar12 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                             (&(*ppCVar9)->m_nodes,local_164[3]);
        pNVar10 = *ppNVar12;
        pNVar14 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        piVar15 = btAlignedObjectArray<int>::operator[]
                            (&local_150,
                             (int)((ulong)((long)pNVar10 - (long)pNVar14) >> 3) * -0x11111111);
        *piVar15 = iVar4;
        local_164[3] = local_164[3] + 1;
      }
    }
    for (local_70 = 0; iVar5 = local_70,
        iVar4 = btAlignedObjectArray<btSoftBody::Face>::size
                          ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0)),
        iVar5 < iVar4; local_70 = local_70 + 1) {
      pFVar16 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_70);
      pNVar10 = pFVar16->m_n[0];
      pNVar14 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      local_164[0] = (int)((ulong)((long)pNVar10 - (long)pNVar14) >> 3) * -0x11111111;
      in_stack_fffffffffffffbf0 =
           (btSoftBody *)
           btAlignedObjectArray<btSoftBody::Face>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_70);
      lVar1 = *(long *)(in_stack_fffffffffffffbf0->super_btCollisionObject).m_worldTransform.m_basis
                       .m_el[1].m_floats;
      pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      local_164[1] = (int)((ulong)(lVar1 - (long)pNVar10) >> 3) * -0x11111111;
      pFVar16 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_70);
      pNVar10 = pFVar16->m_n[2];
      pNVar14 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      local_164[2] = (int)(((long)pNVar10 - (long)pNVar14) / 0x78);
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        piVar15 = btAlignedObjectArray<int>::operator[](&local_150,local_164[local_168]);
        iVar5 = *piVar15;
        for (local_170 = 1; local_170 < 3; local_170 = local_170 + 1) {
          iVar4 = local_164[(local_168 + local_170) % 3];
          piVar15 = btAlignedObjectArray<int>::operator[](&local_150,iVar4);
          if (*piVar15 != iVar5) {
            btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),iVar5);
            btAlignedObjectArray<btSoftBody::Node>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar4);
            iVar6 = btAlignedObjectArray<btSoftBody::Node_*>::findLinearSearch
                              ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70
                               ,(Node **)CONCAT44(in_stack_fffffffffffffa6c,
                                                  in_stack_fffffffffffffa68));
            ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                                 iVar5);
            iVar7 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
            if (iVar6 == iVar7) {
              btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),iVar5);
              btAlignedObjectArray<btSoftBody::Node>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar4);
              btAlignedObjectArray<btSoftBody::Node_*>::push_back
                        ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                         (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
            }
          }
        }
      }
    }
    iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                      ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
    if (1 < iVar5) {
      pvVar17 = btAlignedAllocInternal((size_t)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
      Cluster::Cluster(in_stack_fffffffffffffab0);
      *(undefined1 *)((long)pvVar17 + 0x1a1) = 0;
      btAlignedObjectArray<btSoftBody::Node>::size
                ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
      btAlignedObjectArray<btSoftBody::Node_*>::reserve
                ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                 in_stack_fffffffffffffa6c);
      for (local_194 = 0;
          iVar5 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
          local_194 < iVar5; local_194 = local_194 + 1) {
        btAlignedObjectArray<btSoftBody::Node>::operator[]
                  ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_194);
        btAlignedObjectArray<btSoftBody::Node_*>::push_back
                  ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_fffffffffffffa70,
                   (Node **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      }
      btAlignedObjectArray<btSoftBody::Cluster_*>::push_back
                ((btAlignedObjectArray<btSoftBody::Cluster_*> *)in_stack_fffffffffffffa70,
                 (Cluster **)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),0);
      iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
      b = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),iVar5 + -1);
      btSwap<btSoftBody::Cluster*>(ppCVar9,b);
    }
    for (local_70 = 0; iVar5 = local_70,
        iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
        iVar5 < iVar4; local_70 = local_70 + 1) {
      ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_70)
      ;
      iVar5 = btAlignedObjectArray<btSoftBody::Node_*>::size(&(*ppCVar9)->m_nodes);
      if (iVar5 == 0) {
        local_70 = local_70 + -1;
        releaseCluster(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c);
      }
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x270dd7);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray
              ((btAlignedObjectArray<btVector3> *)0x270de4);
  }
  iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
  if (iVar5 != 0) {
    initializeClusters(in_stack_fffffffffffffbf0);
    updateClusters(in_stack_000000e0);
    btAlignedObjectArray<btSoftBody::Cluster_*>::size
              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
    btAlignedObjectArray<btSoftBody::Cluster_*>::size
              ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
    btAlignedObjectArray<bool>::resize
              ((btAlignedObjectArray<bool> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,(bool *)in_stack_fffffffffffffa70);
    for (local_1c4 = 0;
        iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
        local_1c4 < iVar5; local_1c4 = local_1c4 + 1) {
      ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_1c4
                          );
      (*ppCVar9)->m_clusterIndex = local_1c4;
      for (local_1c8 = 0;
          iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
          local_1c8 < iVar5; local_1c8 = local_1c8 + 1) {
        bVar21 = false;
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_1c4);
        pCVar8 = *ppCVar9;
        ppCVar9 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),
                             local_1c8);
        pCVar2 = *ppCVar9;
        local_1e4 = 0;
        while( true ) {
          bVar3 = false;
          if (!(bool)bVar21) {
            iVar5 = local_1e4;
            iVar4 = btAlignedObjectArray<btSoftBody::Node_*>::size(&pCVar8->m_nodes);
            bVar3 = iVar5 < iVar4;
          }
          if (!bVar3) break;
          local_1e8 = 0;
          while (iVar5 = local_1e8,
                iVar4 = btAlignedObjectArray<btSoftBody::Node_*>::size(&pCVar2->m_nodes),
                iVar5 < iVar4) {
            ppNVar12 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                                 (&pCVar8->m_nodes,local_1e4);
            pNVar10 = *ppNVar12;
            ppNVar12 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                                 (&pCVar2->m_nodes,local_1e8);
            if (pNVar10 == *ppNVar12) {
              bVar21 = true;
              break;
            }
            local_1e8 = local_1e8 + 1;
          }
          local_1e4 = local_1e4 + 1;
        }
        this_00 = (btAlignedObjectArray<bool> *)(in_RDI + 0x5f8);
        iVar5 = local_1c4;
        iVar4 = local_1c8;
        iVar6 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                          ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
        pbVar18 = btAlignedObjectArray<bool>::operator[](this_00,iVar5 + iVar4 * iVar6);
        *pbVar18 = (bool)(bVar21 & 1);
      }
    }
  }
  iVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                    ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8));
  return iVar5;
}

Assistant:

int				btSoftBody::generateClusters(int k,int maxiterations)
{
	int i;
	releaseClusters();
	m_clusters.resize(btMin(k,m_nodes.size()));
	for(i=0;i<m_clusters.size();++i)
	{
		m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
		m_clusters[i]->m_collide=	true;
	}
	k=m_clusters.size();
	if(k>0)
	{
		/* Initialize		*/ 
		btAlignedObjectArray<btVector3>	centers;
		btVector3						cog(0,0,0);
		int								i;
		for(i=0;i<m_nodes.size();++i)
		{
			cog+=m_nodes[i].m_x;
			m_clusters[(i*29873)%m_clusters.size()]->m_nodes.push_back(&m_nodes[i]);
		}
		cog/=(btScalar)m_nodes.size();
		centers.resize(k,cog);
		/* Iterate			*/ 
		const btScalar	slope=16;
		bool			changed;
		int				iterations=0;
		do	{
			const btScalar	w=2-btMin<btScalar>(1,iterations/slope);
			changed=false;
			iterations++;	
			int i;

			for(i=0;i<k;++i)
			{
				btVector3	c(0,0,0);
				for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
				{
					c+=m_clusters[i]->m_nodes[j]->m_x;
				}
				if(m_clusters[i]->m_nodes.size())
				{
					c			/=	(btScalar)m_clusters[i]->m_nodes.size();
					c			=	centers[i]+(c-centers[i])*w;
					changed		|=	((c-centers[i]).length2()>SIMD_EPSILON);
					centers[i]	=	c;
					m_clusters[i]->m_nodes.resize(0);
				}			
			}
			for(i=0;i<m_nodes.size();++i)
			{
				const btVector3	nx=m_nodes[i].m_x;
				int				kbest=0;
				btScalar		kdist=ClusterMetric(centers[0],nx);
				for(int j=1;j<k;++j)
				{
					const btScalar	d=ClusterMetric(centers[j],nx);
					if(d<kdist)
					{
						kbest=j;
						kdist=d;
					}
				}
				m_clusters[kbest]->m_nodes.push_back(&m_nodes[i]);
			}		
		} while(changed&&(iterations<maxiterations));
		/* Merge		*/ 
		btAlignedObjectArray<int>	cids;
		cids.resize(m_nodes.size(),-1);
		for(i=0;i<m_clusters.size();++i)
		{
			for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
			{
				cids[int(m_clusters[i]->m_nodes[j]-&m_nodes[0])]=i;
			}
		}
		for(i=0;i<m_faces.size();++i)
		{
			const int idx[]={	int(m_faces[i].m_n[0]-&m_nodes[0]),
				int(m_faces[i].m_n[1]-&m_nodes[0]),
				int(m_faces[i].m_n[2]-&m_nodes[0])};
			for(int j=0;j<3;++j)
			{
				const int cid=cids[idx[j]];
				for(int q=1;q<3;++q)
				{
					const int kid=idx[(j+q)%3];
					if(cids[kid]!=cid)
					{
						if(m_clusters[cid]->m_nodes.findLinearSearch(&m_nodes[kid])==m_clusters[cid]->m_nodes.size())
						{
							m_clusters[cid]->m_nodes.push_back(&m_nodes[kid]);
						}
					}
				}
			}
		}
		/* Master		*/ 
		if(m_clusters.size()>1)
		{
			Cluster*	pmaster=new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
			pmaster->m_collide	=	false;
			pmaster->m_nodes.reserve(m_nodes.size());
			for(int i=0;i<m_nodes.size();++i) pmaster->m_nodes.push_back(&m_nodes[i]);
			m_clusters.push_back(pmaster);
			btSwap(m_clusters[0],m_clusters[m_clusters.size()-1]);
		}
		/* Terminate	*/ 
		for(i=0;i<m_clusters.size();++i)
		{
			if(m_clusters[i]->m_nodes.size()==0)
			{
				releaseCluster(i--);
			}
		}
	} else
	{
		//create a cluster for each tetrahedron (if tetrahedra exist) or each face
		if (m_tetras.size())
		{
			m_clusters.resize(m_tetras.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}
			for (i=0;i<m_tetras.size();i++)
			{
				for (int j=0;j<4;j++)
				{
					m_clusters[i]->m_nodes.push_back(m_tetras[i].m_n[j]);
				}
			}

		} else
		{
			m_clusters.resize(m_faces.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}

			for(i=0;i<m_faces.size();++i)
			{
				for(int j=0;j<3;++j)
				{
					m_clusters[i]->m_nodes.push_back(m_faces[i].m_n[j]);
				}
			}
		}
	}

	if (m_clusters.size())
	{
		initializeClusters();
		updateClusters();


		//for self-collision
		m_clusterConnectivity.resize(m_clusters.size()*m_clusters.size());
		{
			for (int c0=0;c0<m_clusters.size();c0++)
			{
				m_clusters[c0]->m_clusterIndex=c0;
				for (int c1=0;c1<m_clusters.size();c1++)
				{
					
					bool connected=false;
					Cluster* cla = m_clusters[c0];
					Cluster* clb = m_clusters[c1];
					for (int i=0;!connected&&i<cla->m_nodes.size();i++)
					{
						for (int j=0;j<clb->m_nodes.size();j++)
						{
							if (cla->m_nodes[i] == clb->m_nodes[j])
							{
								connected=true;
								break;
							}
						}
					}
					m_clusterConnectivity[c0+c1*m_clusters.size()]=connected;
				}
			}
		}
	}

	return(m_clusters.size());
}